

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_istype(lua_State *L)

{
  CTypeID id;
  uint flags;
  CTState *cts_00;
  TValue *pTVar1;
  ulong uVar2;
  CType *d;
  lua_State *in_RDI;
  CType *ct2;
  CType *ct1;
  CTypeID id2;
  GCcdata *cd;
  int b;
  TValue *o;
  CTypeID id1;
  CTState *cts;
  CTState *cts_1;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff78;
  uint id_00;
  uint local_74;
  CType *local_50;
  TValue *in_stack_ffffffffffffffe8;
  
  cts_00 = (CTState *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0xfc);
  cts_00->L = in_RDI;
  id = ffi_checkctype(in_RDI,cts_00,in_stack_ffffffffffffffe8);
  pTVar1 = lj_lib_checkany((lua_State *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  local_74 = 0;
  if ((pTVar1->field_2).it == 0xfffffff5) {
    uVar2 = (ulong)(pTVar1->u32).lo;
    if (*(short *)(uVar2 + 6) == 0x15) {
      flags = *(uint *)(uVar2 + 8);
    }
    else {
      flags = (uint)*(ushort *)(uVar2 + 6);
    }
    id_00 = flags;
    d = lj_ctype_rawref(cts_00,id);
    local_50 = lj_ctype_rawref(cts_00,id_00);
    if (d == local_50) {
      local_74 = 1;
    }
    else if ((d->info >> 0x1c == local_50->info >> 0x1c) && (d->size == local_50->size)) {
      if (d->info >> 0x1d == 1) {
        local_74 = lj_cconv_compatptr((CTState *)CONCAT44(id_00,in_stack_ffffffffffffff78),d,
                                      local_50,flags);
      }
      else if ((d->info >> 0x1c == 0) || (d->info >> 0x1c == 4)) {
        local_74 = (uint)(((d->info ^ local_50->info) & 0xfcbfffff) == 0);
      }
    }
    else if ((d->info >> 0x1c == 1) && (local_50->info >> 0x1c == 2)) {
      do {
        local_50 = cts_00->tab + (local_50->info & 0xffff);
      } while (local_50->info >> 0x1c == 8);
      if (d == local_50) {
        local_74 = 1;
      }
    }
  }
  *(uint *)((long)in_RDI->top + -4) = -2 - local_74;
  *(uint *)((ulong)(in_RDI->glref).ptr32 + 0xac) = -2 - local_74;
  return 1;
}

Assistant:

LJLIB_CF(ffi_istype)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id1 = ffi_checkctype(L, cts, NULL);
  TValue *o = lj_lib_checkany(L, 2);
  int b = 0;
  if (tviscdata(o)) {
    GCcdata *cd = cdataV(o);
    CTypeID id2 = cd->ctypeid == CTID_CTYPEID ? *(CTypeID *)cdataptr(cd) :
						cd->ctypeid;
    CType *ct1 = lj_ctype_rawref(cts, id1);
    CType *ct2 = lj_ctype_rawref(cts, id2);
    if (ct1 == ct2) {
      b = 1;
    } else if (ctype_type(ct1->info) == ctype_type(ct2->info) &&
	       ct1->size == ct2->size) {
      if (ctype_ispointer(ct1->info))
	b = lj_cconv_compatptr(cts, ct1, ct2, CCF_IGNQUAL);
      else if (ctype_isnum(ct1->info) || ctype_isvoid(ct1->info))
	b = (((ct1->info ^ ct2->info) & ~(CTF_QUAL|CTF_LONG)) == 0);
    } else if (ctype_isstruct(ct1->info) && ctype_isptr(ct2->info) &&
	       ct1 == ctype_rawchild(cts, ct2)) {
      b = 1;
    }
  }
  setboolV(L->top-1, b);
  setboolV(&G(L)->tmptv2, b);  /* Remember for trace recorder. */
  return 1;
}